

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O3

int EVP_PKEY_derive_set_peer(EVP_PKEY_CTX *ctx,EVP_PKEY *peer)

{
  long lVar1;
  int iVar2;
  int line;
  
  if ((((ctx == (EVP_PKEY_CTX *)0x0) || (lVar1 = *(long *)ctx, lVar1 == 0)) ||
      ((*(long *)(lVar1 + 0x60) == 0 &&
       ((*(long *)(lVar1 + 0x50) == 0 && (*(long *)(lVar1 + 0x58) == 0)))))) ||
     (*(code **)(lVar1 + 0x70) == (code *)0x0)) {
    iVar2 = 0x7d;
    line = 0x128;
  }
  else {
    iVar2 = *(int *)(ctx + 0x20);
    if (((iVar2 == 0x40) || (iVar2 == 0x80)) || (iVar2 == 0x100)) {
      iVar2 = (**(code **)(lVar1 + 0x70))(ctx,3,0,peer);
      if (iVar2 < 1) {
        return 0;
      }
      if (iVar2 == 2) {
        return 1;
      }
      if (*(long *)(ctx + 0x10) == 0) {
        iVar2 = 0x78;
        line = 0x13d;
      }
      else if (*(int *)(*(long *)(ctx + 0x10) + 4) == peer->save_type) {
        iVar2 = EVP_PKEY_missing_parameters(peer);
        if ((iVar2 != 0) ||
           (iVar2 = EVP_PKEY_cmp_parameters(*(EVP_PKEY **)(ctx + 0x10),peer), iVar2 != 0)) {
          EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x18));
          *(EVP_PKEY **)(ctx + 0x18) = peer;
          iVar2 = (**(code **)(*(long *)ctx + 0x70))(ctx,3,1,peer);
          if (0 < iVar2) {
            EVP_PKEY_up_ref((EVP_PKEY *)peer);
            return 1;
          }
          *(undefined8 *)(ctx + 0x18) = 0;
          return 0;
        }
        iVar2 = 0x68;
        line = 0x14d;
      }
      else {
        iVar2 = 0x67;
        line = 0x142;
      }
    }
    else {
      iVar2 = 0x7e;
      line = 0x12e;
    }
  }
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_derive_set_peer(EVP_PKEY_CTX *ctx, EVP_PKEY *peer) {
  int ret;
  if (!ctx || !ctx->pmeth ||
      !(ctx->pmeth->derive || ctx->pmeth->encrypt || ctx->pmeth->decrypt) ||
      !ctx->pmeth->ctrl) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }
  if (ctx->operation != EVP_PKEY_OP_DERIVE &&
      ctx->operation != EVP_PKEY_OP_ENCRYPT &&
      ctx->operation != EVP_PKEY_OP_DECRYPT) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATON_NOT_INITIALIZED);
    return 0;
  }

  ret = ctx->pmeth->ctrl(ctx, EVP_PKEY_CTRL_PEER_KEY, 0, peer);

  if (ret <= 0) {
    return 0;
  }

  if (ret == 2) {
    return 1;
  }

  if (!ctx->pkey) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }

  if (ctx->pkey->type != peer->type) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_KEY_TYPES);
    return 0;
  }

  // ran@cryptocom.ru: For clarity.  The error is if parameters in peer are
  // present (!missing) but don't match.  EVP_PKEY_cmp_parameters may return
  // 1 (match), 0 (don't match) and -2 (comparison is not defined).  -1
  // (different key types) is impossible here because it is checked earlier.
  // -2 is OK for us here, as well as 1, so we can check for 0 only.
  if (!EVP_PKEY_missing_parameters(peer) &&
      !EVP_PKEY_cmp_parameters(ctx->pkey, peer)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_PARAMETERS);
    return 0;
  }

  EVP_PKEY_free(ctx->peerkey);
  ctx->peerkey = peer;

  ret = ctx->pmeth->ctrl(ctx, EVP_PKEY_CTRL_PEER_KEY, 1, peer);

  if (ret <= 0) {
    ctx->peerkey = NULL;
    return 0;
  }

  EVP_PKEY_up_ref(peer);
  return 1;
}